

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-client.c
# Opt level: O2

int ratelimit_connects(uint *last,uint secs)

{
  bool bVar1;
  timeval tv;
  
  gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
  bVar1 = 1 < (long)(tv.tv_sec - (ulong)*last);
  if (bVar1) {
    *last = (uint)tv.tv_sec;
  }
  return (uint)bVar1;
}

Assistant:

static int ratelimit_connects(unsigned int *last, unsigned int secs)
{
	struct timeval tv;

	gettimeofday(&tv, NULL);

	if (tv.tv_sec - (*last) < secs)
		return 0;

	*last = tv.tv_sec;

	return 1;
}